

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O0

bool __thiscall QRhiWidgetPrivate::invokeInitialize(QRhiWidgetPrivate *this,QRhiCommandBuffer *cb)

{
  uint uVar1;
  QRhiWidget *pQVar2;
  QRhiRenderBuffer *pQVar3;
  ulong uVar4;
  QRhiTextureRenderTarget *pQVar5;
  QRhiRenderPassDescriptor *pQVar6;
  undefined8 in_RSI;
  QRhiWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar7;
  QRhiWidget *q;
  QSize pixelSize;
  QRhiColorAttachment color0;
  QRhiTextureRenderTargetDescription rtDesc;
  QSize *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd44;
  char *in_stack_fffffffffffffd48;
  QRhi *file;
  QRhi *in_stack_fffffffffffffd50;
  byte local_271;
  char local_270 [36];
  undefined1 local_24c [4];
  char local_248 [32];
  QSize local_228;
  char local_220 [36];
  Format local_1fc;
  QSize local_1f8;
  QRhiColorAttachment local_1f0;
  QRhiTextureRenderTargetDescription local_1c0 [440];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  if ((in_RDI->colorTexture == (QRhiTexture *)0x0) &&
     (in_RDI->msaaColorBuffer == (QRhiRenderBuffer *)0x0)) {
    local_271 = 0;
  }
  else {
    if ((in_RDI->autoRenderTarget & 1U) == 0) {
      resetRenderTargetObjects
                ((QRhiWidgetPrivate *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40))
      ;
    }
    else {
      local_1f8 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      if (in_RDI->colorTexture == (QRhiTexture *)0x0) {
        local_1f8 = QRhiRenderBuffer::pixelSize
                              ((QRhiRenderBuffer *)
                               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
      }
      else {
        local_1f8 = QRhiTexture::pixelSize
                              ((QRhiTexture *)
                               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
      }
      if (in_RDI->depthStencilBuffer == (QRhiRenderBuffer *)0x0) {
        in_stack_fffffffffffffd50 = in_RDI->rhi;
        uVar1 = in_RDI->samples;
        memset(&local_1fc,0,4);
        QFlags<QRhiRenderBuffer::Flag>::QFlags((QFlags<QRhiRenderBuffer::Flag> *)0x348ba8);
        pQVar3 = (QRhiRenderBuffer *)
                 QRhi::newRenderBuffer
                           ((Type)in_stack_fffffffffffffd50,(QSize *)0x0,
                            (int)&stack0xfffffffffffffd40 + 200,(QFlags_conflict1 *)(ulong)uVar1,
                            local_1fc);
        in_RDI->depthStencilBuffer = pQVar3;
        uVar4 = (**(code **)(*(long *)in_RDI->depthStencilBuffer + 0x20))();
        if ((uVar4 & 1) == 0) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                     in_stack_fffffffffffffd44,(char *)in_stack_fffffffffffffd38);
          QMessageLogger::warning(local_220,"Failed to create depth-stencil buffer for QRhiWidget");
          resetRenderTargetObjects
                    ((QRhiWidgetPrivate *)
                     CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
          local_271 = 0;
          goto LAB_00348ec3;
        }
      }
      else {
        local_228 = QRhiRenderBuffer::pixelSize
                              ((QRhiRenderBuffer *)
                               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
        bVar7 = ::operator!=((QSize *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                             in_stack_fffffffffffffd38);
        if (bVar7) {
          QRhiRenderBuffer::setPixelSize(in_RDI->depthStencilBuffer,&local_1f8);
          uVar4 = (**(code **)(*(long *)in_RDI->depthStencilBuffer + 0x20))();
          if ((uVar4 & 1) == 0) {
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                       in_stack_fffffffffffffd44,(char *)in_stack_fffffffffffffd38);
            QMessageLogger::warning
                      (local_248,
                       "Failed to rebuild depth-stencil buffer for QRhiWidget with new size");
            local_271 = 0;
            goto LAB_00348ec3;
          }
        }
      }
      if (in_RDI->renderTarget == (QRhiTextureRenderTarget *)0x0) {
        memset(&local_1f0,0xaa,0x30);
        QRhiColorAttachment::QRhiColorAttachment(&local_1f0);
        if (in_RDI->colorTexture == (QRhiTexture *)0x0) {
          QRhiColorAttachment::setRenderBuffer(&local_1f0,in_RDI->msaaColorBuffer);
        }
        else {
          QRhiColorAttachment::setTexture(&local_1f0,in_RDI->colorTexture);
        }
        if (1 < in_RDI->samples) {
          QRhiColorAttachment::setResolveTexture(&local_1f0,in_RDI->resolveTexture);
        }
        memset(local_1c0,0xaa,0x1b8);
        QRhiTextureRenderTargetDescription::QRhiTextureRenderTargetDescription
                  (local_1c0,(QRhiColorAttachment *)&local_1f0,in_RDI->depthStencilBuffer);
        file = in_RDI->rhi;
        memset(local_24c,0,4);
        QFlags<QRhiTextureRenderTarget::Flag>::QFlags
                  ((QFlags<QRhiTextureRenderTarget::Flag> *)0x348dd3);
        pQVar5 = (QRhiTextureRenderTarget *)
                 QRhi::newTextureRenderTarget
                           ((QRhiTextureRenderTargetDescription *)file,(QFlags_conflict1 *)local_1c0
                           );
        in_RDI->renderTarget = pQVar5;
        pQVar6 = (QRhiRenderPassDescriptor *)(**(code **)(*(long *)in_RDI->renderTarget + 0x38))();
        in_RDI->renderPassDescriptor = pQVar6;
        QRhiRenderTarget::setRenderPassDescriptor
                  ((QRhiRenderTarget *)in_RDI->renderTarget,in_RDI->renderPassDescriptor);
        uVar4 = (**(code **)(*(long *)in_RDI->renderTarget + 0x40))();
        bVar7 = (uVar4 & 1) == 0;
        if (bVar7) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffffd50,(char *)file,
                     in_stack_fffffffffffffd44,(char *)in_stack_fffffffffffffd38);
          QMessageLogger::warning(local_270,"Failed to create render target for QRhiWidget");
          resetRenderTargetObjects
                    ((QRhiWidgetPrivate *)
                     CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
          local_271 = 0;
        }
        QRhiTextureRenderTargetDescription::~QRhiTextureRenderTargetDescription
                  ((QRhiTextureRenderTargetDescription *)0x348e91);
        if (bVar7) goto LAB_00348ec3;
      }
    }
    (**(code **)(*(long *)&pQVar2->super_QWidget + 0x1a0))(pQVar2,in_RSI);
    local_271 = 1;
  }
LAB_00348ec3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_271 & 1);
}

Assistant:

bool QRhiWidgetPrivate::invokeInitialize(QRhiCommandBuffer *cb)
{
    Q_Q(QRhiWidget);
    if (!colorTexture && !msaaColorBuffer)
        return false;

    if (autoRenderTarget) {
        const QSize pixelSize = colorTexture ? colorTexture->pixelSize() : msaaColorBuffer->pixelSize();
        if (!depthStencilBuffer) {
            depthStencilBuffer = rhi->newRenderBuffer(QRhiRenderBuffer::DepthStencil, pixelSize, samples);
            if (!depthStencilBuffer->create()) {
                qWarning("Failed to create depth-stencil buffer for QRhiWidget");
                resetRenderTargetObjects();
                return false;
            }
        } else if (depthStencilBuffer->pixelSize() != pixelSize) {
            depthStencilBuffer->setPixelSize(pixelSize);
            if (!depthStencilBuffer->create()) {
                qWarning("Failed to rebuild depth-stencil buffer for QRhiWidget with new size");
                return false;
            }
        }

        if (!renderTarget) {
            QRhiColorAttachment color0;
            if (colorTexture)
                color0.setTexture(colorTexture);
            else
                color0.setRenderBuffer(msaaColorBuffer);
            if (samples > 1)
                color0.setResolveTexture(resolveTexture);
            QRhiTextureRenderTargetDescription rtDesc(color0, depthStencilBuffer);
            renderTarget = rhi->newTextureRenderTarget(rtDesc);
            renderPassDescriptor = renderTarget->newCompatibleRenderPassDescriptor();
            renderTarget->setRenderPassDescriptor(renderPassDescriptor);
            if (!renderTarget->create()) {
                qWarning("Failed to create render target for QRhiWidget");
                resetRenderTargetObjects();
                return false;
            }
        }
    } else {
        resetRenderTargetObjects();
    }

    q->initialize(cb);

    return true;
}